

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append.cpp
# Opt level: O0

int main(void)

{
  variant<int,_float,_double> ele;
  variant<int,_float,_double> ele_00;
  variant<int,_float,_double> ele_01;
  int iVar1;
  ostream *this;
  int i;
  heterovector hetvec;
  _Variadic_union<int,_float,_double> in_stack_ffffffffffffff68;
  variant<int,_float,_double> *in_stack_ffffffffffffff70;
  int local_78;
  int index;
  heterovector *in_stack_ffffffffffffff90;
  
  heterovector::heterovector((heterovector *)0x101481);
  std::variant<int,float,double>::variant<int,void,void,int,void>
            (in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = in_stack_ffffffffffffff70;
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)in_stack_ffffffffffffff68;
  heterovector::append((heterovector *)0x1014ab,ele);
  std::variant<int,float,double>::variant<int,void,void,int,void>
            (in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = in_stack_ffffffffffffff70;
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)in_stack_ffffffffffffff68;
  heterovector::append((heterovector *)0x1014d7,ele_00);
  index = 0;
  std::variant<int,float,double>::variant<int,void,void,int,void>
            (in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
  ele_01.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = in_stack_ffffffffffffff70;
  ele_01.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)in_stack_ffffffffffffff68;
  heterovector::append((heterovector *)0x101503,ele_01);
  for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
    iVar1 = heterovector::get<int>(in_stack_ffffffffffffff90,index);
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  heterovector::~heterovector((heterovector *)0x101590);
  return 0;
}

Assistant:

int main() {
    heterovector hetvec;

    hetvec.append(3);
    hetvec.append(1);
    hetvec.append(0);

    for (int i = 0; i < 3; i++) {
        std::cout << hetvec.get<int>(i) << std::endl;
    }

    return 0;
}